

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

string * __thiscall
leveldb::Status::ToString_abi_cxx11_(string *__return_storage_ptr__,Status *this)

{
  size_t sVar1;
  uint uVar2;
  char *__s;
  long in_FS_OFFSET;
  char tmp [30];
  char acStack_48 [32];
  long local_28;
  
  __s = acStack_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->state_ == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0065800a;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"OK","");
  }
  else {
    uVar2 = (uint)this->state_[4];
    if (uVar2 < 6) {
      __s = &DAT_0084c8f8 + *(int *)(&DAT_0084c8f8 + ((ulong)uVar2 & 0xff) * 4);
    }
    else {
      snprintf(acStack_48,0x1e,"Unknown code(%d): ");
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(char *)((long)this->state_ + 5),(ulong)*(uint *)this->state_)
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0065800a:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (state_ == nullptr) {
    return "OK";
  } else {
    char tmp[30];
    const char* type;
    switch (code()) {
      case kOk:
        type = "OK";
        break;
      case kNotFound:
        type = "NotFound: ";
        break;
      case kCorruption:
        type = "Corruption: ";
        break;
      case kNotSupported:
        type = "Not implemented: ";
        break;
      case kInvalidArgument:
        type = "Invalid argument: ";
        break;
      case kIOError:
        type = "IO error: ";
        break;
      default:
        snprintf(tmp, sizeof(tmp),
                 "Unknown code(%d): ", static_cast<int>(code()));
        type = tmp;
        break;
    }
    std::string result(type);
    uint32_t length;
    memcpy(&length, state_, sizeof(length));
    result.append(state_ + 5, length);
    return result;
  }
}